

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O0

bool findPrimePower(int q,int *p,int *n)

{
  uint uVar1;
  bool bVar2;
  int *in_RDX;
  uint *in_RSI;
  uint in_EDI;
  double dVar3;
  double dVar4;
  int k;
  int firstfactor;
  uint in_stack_ffffffffffffffe0;
  uint n_00;
  uint local_1c;
  uint local_8;
  bool local_1;
  
  local_1c = 0;
  *in_RDX = 0;
  *in_RSI = 0;
  if ((int)in_EDI < 2) {
    local_1 = false;
  }
  else {
    bVar2 = isPrime(in_stack_ffffffffffffffe0);
    if (bVar2) {
      *in_RSI = in_EDI;
      *in_RDX = 1;
      local_1 = true;
    }
    else {
      n_00 = 2;
      while ((dVar3 = (double)(int)n_00, dVar4 = sqrt((double)(int)in_EDI + 1.0), uVar1 = local_1c,
             dVar3 < dVar4 && (uVar1 = n_00, (int)in_EDI % (int)n_00 != 0))) {
        n_00 = n_00 + 1;
      }
      local_1c = uVar1;
      bVar2 = isPrime(n_00);
      local_8 = in_EDI;
      if (bVar2) {
        for (; local_8 != 1; local_8 = (int)local_8 / (int)local_1c) {
          if ((int)local_8 % (int)local_1c != 0) {
            return false;
          }
          *in_RDX = *in_RDX + 1;
        }
        *in_RSI = local_1c;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool findPrimePower(int q, int* p, int* n)
{
    int firstfactor = 0;
    *p = *n = 0;

    if (q <= 1)
        return false;

    if (isPrime(q))
    {
        *p = q;
        *n = 1;
        return true;
    }

    for (int k = 2; k < sqrt(double(q) + 1.0); k++)
    {
        if ((q % k) == 0)
        {
            firstfactor = k;
            break;
        }
    }

    if (!isPrime(firstfactor))
        return false;

    while (true)
    {
        if (q == 1)
        {
            *p = firstfactor;
            return true;
        }
        if (q % firstfactor == 0)
        {
            *n += 1;
            q /= firstfactor;
        }
        else
            return false;
    }
}